

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O3

void model_rd_for_sb(AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,int plane_from,
                    int plane_to,int *out_rate_sum,int64_t *out_dist_sum,uint8_t *skip_txfm_sb,
                    int64_t *skip_sse_sb,int *plane_rate,int64_t *plane_sse,int64_t *plane_dist)

{
  BLOCK_SIZE BVar1;
  MACROBLOCK *pMVar2;
  int iVar3;
  long lVar4;
  _func_int64_t_uint8_t_ptr_int_uint8_t_ptr_int_int_int **pp_Var5;
  int64_t iVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  int *piVar10;
  long var;
  int16_t **ppiVar11;
  int rate;
  int local_a4;
  long local_a0;
  MACROBLOCKD *local_98;
  ulong local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  int64_t *local_68;
  int64_t *local_60;
  int *local_58;
  BLOCK_SIZE (*local_50) [2] [2];
  MACROBLOCK *local_48;
  AV1_COMP *local_40;
  long local_38;
  
  if (plane_to < plane_from) {
    local_88 = 0;
    local_78 = 0;
    local_80 = 0;
  }
  else {
    local_70 = (long)(*xd->mi)->ref_frame[0];
    lVar4 = (long)plane_from;
    local_58 = plane_rate + lVar4;
    local_60 = plane_sse + lVar4;
    local_68 = plane_dist + lVar4;
    local_a0 = -lVar4;
    ppiVar11 = &x->plane[lVar4].dequant_QTX;
    piVar10 = &xd->plane[lVar4].subsampling_x;
    local_90 = (ulong)((plane_to - plane_from) + 1);
    lVar4 = 0;
    local_50 = av1_ss_size_lookup + bsize;
    local_80 = 0;
    local_78 = 0;
    local_88 = 0;
    local_98 = xd;
    local_48 = x;
    local_40 = cpi;
    do {
      if ((local_a0 != lVar4) && (local_98->is_chroma_ref != true)) break;
      pp_Var5 = &aom_highbd_sse;
      if ((local_98->cur_buf->flags & 8) == 0) {
        pp_Var5 = &aom_sse;
      }
      BVar1 = (*local_50)[*piVar10][piVar10[1]];
      iVar3 = local_98->bd;
      iVar6 = (**pp_Var5)(((buf_2d *)(ppiVar11 + -10))->buf,*(int *)(ppiVar11 + -7),
                          ((buf_2d *)(piVar10 + 3))->buf,piVar10[9],(int)block_size_wide[BVar1],
                          (int)block_size_high[BVar1]);
      pMVar2 = local_48;
      bVar9 = (char)iVar3 * '\x02' - 0x10;
      var = (long)((ulong)((uint)(1 << (bVar9 & 0x1f)) >> 1) + iVar6) >> (bVar9 & 0x3f);
      bVar9 = 3;
      if ((((local_48->e_mbd).cur_buf)->flags & 8) != 0) {
        bVar9 = (char)(local_48->e_mbd).bd - 5;
      }
      if ((local_40->sf).rd_sf.simple_model_rd_from_var == 0) {
        av1_model_rd_from_var_lapndz
                  (var,(uint)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[BVar1],
                   (int)(*ppiVar11)[1] >> (bVar9 & 0x1f),&local_a4,&local_38);
        lVar7 = local_38;
      }
      else {
        iVar3 = (int)(*ppiVar11)[1] >> (bVar9 & 0x1f);
        lVar7 = 0;
        if ((iVar3 < 0x78) &&
           (lVar7 = (long)((ulong)(0x118 - iVar3) * var) >> 7, 0x7ffffffe < lVar7)) {
          lVar7 = 0x7fffffff;
        }
        local_a4 = (int)lVar7;
        lVar7 = iVar3 * var >> 8;
      }
      if (local_a0 == lVar4) {
        lVar8 = 0xffffffff;
        if (var < 0xffffffff) {
          lVar8 = var;
        }
        pMVar2->pred_sse[local_70] = (uint)lVar8;
      }
      if (plane_rate != (int *)0x0) {
        local_58[lVar4] = local_a4;
      }
      if (plane_sse != (int64_t *)0x0) {
        local_60[lVar4] = var;
      }
      if (plane_dist != (int64_t *)0x0) {
        local_68[lVar4] = lVar7 * 0x10;
      }
      local_88 = local_88 + var;
      local_80 = local_80 + local_a4;
      local_78 = local_78 + lVar7 * 0x10;
      lVar4 = lVar4 + 1;
      ppiVar11 = ppiVar11 + 0x11;
      piVar10 = piVar10 + 0x28c;
    } while ((int)local_90 != (int)lVar4);
  }
  if (skip_txfm_sb != (uint8_t *)0x0) {
    *skip_txfm_sb = local_88 == 0;
  }
  if (skip_sse_sb != (int64_t *)0x0) {
    *skip_sse_sb = local_88 << 4;
  }
  lVar4 = 0x7fffffff;
  if (local_80 < 0x7fffffff) {
    lVar4 = local_80;
  }
  *out_rate_sum = (int)lVar4;
  *out_dist_sum = local_78;
  return;
}

Assistant:

static inline void model_rd_for_sb(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                                   MACROBLOCK *x, MACROBLOCKD *xd,
                                   int plane_from, int plane_to,
                                   int *out_rate_sum, int64_t *out_dist_sum,
                                   uint8_t *skip_txfm_sb, int64_t *skip_sse_sb,
                                   int *plane_rate, int64_t *plane_sse,
                                   int64_t *plane_dist) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  int plane;
  const int ref = xd->mi[0]->ref_frame[0];

  int64_t rate_sum = 0;
  int64_t dist_sum = 0;
  int64_t total_sse = 0;

  assert(bsize < BLOCK_SIZES_ALL);

  for (plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    struct macroblock_plane *const p = &x->plane[plane];
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    assert(plane_bsize < BLOCK_SIZES_ALL);
    const int bw = block_size_wide[plane_bsize];
    const int bh = block_size_high[plane_bsize];
    int64_t sse;
    int rate;
    int64_t dist;

    sse = calculate_sse(xd, p, pd, bw, bh);

    model_rd_from_sse(cpi, x, plane_bsize, plane, sse, bw * bh, &rate, &dist);

    if (plane == 0) x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

    total_sse += sse;
    rate_sum += rate;
    dist_sum += dist;
    if (plane_rate) plane_rate[plane] = rate;
    if (plane_sse) plane_sse[plane] = sse;
    if (plane_dist) plane_dist[plane] = dist;
    assert(rate_sum >= 0);
  }

  if (skip_txfm_sb) *skip_txfm_sb = total_sse == 0;
  if (skip_sse_sb) *skip_sse_sb = total_sse << 4;
  rate_sum = AOMMIN(rate_sum, INT_MAX);
  *out_rate_sum = (int)rate_sum;
  *out_dist_sum = dist_sum;
}